

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O3

StripCtrlChars *
stripctrl_new_term_fn
          (BinarySink *bs_out,_Bool permit_cr,wchar_t substitution,Terminal *term,
          _func_unsigned_long_Terminal_ptr_term_utf8_decode_ptr_uchar *translate)

{
  void *__s;
  
  __s = safemalloc(1,0xb0,0);
  memset(__s,0,0x90);
  *(BinarySink **)((long)__s + 0x90) = bs_out;
  *(_Bool *)((long)__s + 0x10) = permit_cr;
  *(wchar_t *)((long)__s + 0x14) = substitution;
  *(Terminal **)((long)__s + 0x60) = term;
  *(_func_unsigned_long_Terminal_ptr_term_utf8_decode_ptr_uchar **)((long)__s + 0x78) = translate;
  *(code **)((long)__s + 0x98) = stripctrl_term_BinarySink_write;
  *(undefined8 *)((long)__s + 0xa0) = 0;
  *(StripCtrlChars **)((long)__s + 0xa8) = (StripCtrlChars *)((long)__s + 0x98);
  return (StripCtrlChars *)((long)__s + 0x98);
}

Assistant:

StripCtrlChars *stripctrl_new_term_fn(
    BinarySink *bs_out, bool permit_cr, wchar_t substitution,
    Terminal *term, unsigned long (*translate)(
        Terminal *, term_utf8_decode *, unsigned char))
{
    StripCtrlCharsImpl *scc = stripctrl_new_common(
        bs_out, permit_cr, substitution);
    scc->term = term;
    scc->translate = translate;
    BinarySink_INIT(&scc->public, stripctrl_term_BinarySink_write);
    return &scc->public;
}